

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O3

StringRef __thiscall
llvm::yaml::ScalarTraits<bool,_void>::input
          (ScalarTraits<bool,_void> *this,StringRef Scalar,void *param_2,bool *Val)

{
  undefined1 uVar1;
  char *pcVar2;
  size_t sVar3;
  StringRef SVar4;
  
  pcVar2 = "invalid boolean";
  sVar3 = 0xf;
  if (Scalar.Data == (char *)0x5) {
    if (this[4] != (ScalarTraits<bool,_void>)0x65 || *(int *)this != 0x736c6166) goto LAB_00dade5a;
    uVar1 = 0;
  }
  else {
    if ((Scalar.Data != (char *)0x4) || (*(int *)this != 0x65757274)) goto LAB_00dade5a;
    uVar1 = 1;
  }
  *(undefined1 *)param_2 = uVar1;
  sVar3 = 0;
  pcVar2 = (char *)0x0;
LAB_00dade5a:
  SVar4.Length = sVar3;
  SVar4.Data = pcVar2;
  return SVar4;
}

Assistant:

StringRef ScalarTraits<bool>::input(StringRef Scalar, void *, bool &Val) {
  if (Scalar.equals("true")) {
    Val = true;
    return StringRef();
  } else if (Scalar.equals("false")) {
    Val = false;
    return StringRef();
  }
  return "invalid boolean";
}